

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FibHeap.h
# Opt level: O3

void __thiscall
FibHeap<std::pair<double,_int>_>::decKey
          (FibHeap<std::pair<double,_int>_> *this,Node *x,pair<double,_int> *key)

{
  double dVar1;
  double dVar2;
  int iVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *x_00;
  
  dVar1 = key->first;
  (x->key).first = dVar1;
  iVar3 = key->second;
  (x->key).second = iVar3;
  x_00 = x->p;
  if ((x_00 != (Node *)0x0) &&
     ((dVar2 = (x_00->key).first, dVar1 < dVar2 ||
      ((dVar1 <= dVar2 && (iVar3 < (x_00->key).second)))))) {
    cut(this,x);
    pNVar4 = x_00->p;
    while (pNVar5 = pNVar4, pNVar5 != (Node *)0x0) {
      if (x_00->mark == false) {
        x_00->mark = true;
        break;
      }
      cut(this,x_00);
      x_00 = pNVar5;
      pNVar4 = pNVar5->p;
    }
  }
  dVar1 = (x->key).first;
  dVar2 = (this->min->key).first;
  if ((dVar1 < dVar2) || ((dVar1 <= dVar2 && ((x->key).second < (this->min->key).second)))) {
    this->min = x;
  }
  return;
}

Assistant:

void decKey(Node *x, const K &key)
	{
		x->key = key;
		Node *y = x->p;
		if (y && x->key < y->key)
			cut(x), cascadingCut(y);
		if (x->key < min->key)
			min = x;
	}